

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

char __thiscall Jupiter::IRC::Client::Channel::getUserPrefix(Channel *this,string_view in_nickname)

{
  bool bVar1;
  element_type *in_user;
  string_view in_nickname_00;
  undefined1 local_38 [8];
  shared_ptr<Jupiter::IRC::Client::Channel::User> user;
  Channel *this_local;
  string_view in_nickname_local;
  
  in_nickname_00._M_str = (char *)in_nickname._M_len;
  in_nickname_00._M_len = (size_t)this;
  user.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  getUser((Channel *)local_38,in_nickname_00);
  bVar1 = std::operator==((shared_ptr<Jupiter::IRC::Client::Channel::User> *)local_38,(nullptr_t)0x0
                         );
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    in_nickname_local._M_str._7_1_ = '\0';
  }
  else {
    in_user = std::
              __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    in_nickname_local._M_str._7_1_ = getUserPrefix(this,in_user);
  }
  std::shared_ptr<Jupiter::IRC::Client::Channel::User>::~shared_ptr
            ((shared_ptr<Jupiter::IRC::Client::Channel::User> *)local_38);
  return in_nickname_local._M_str._7_1_;
}

Assistant:

char Jupiter::IRC::Client::Channel::getUserPrefix(std::string_view in_nickname) const {
	auto user = getUser(in_nickname);

	if (user != nullptr)
		return this->getUserPrefix(*user);

	return 0;
}